

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

void UpdateMeshReferences
               (aiNode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *meshMapping)

{
  uint uVar1;
  uint a;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint i;
  ulong uVar6;
  
  uVar3 = node->mNumMeshes;
  if (uVar3 != 0) {
    uVar6 = 0;
    for (uVar2 = 0; uVar4 = (uint)uVar6, uVar2 < uVar3; uVar2 = uVar2 + 1) {
      uVar1 = (meshMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start[node->mMeshes[uVar2]];
      uVar5 = uVar6;
      if (uVar1 != 0xffffffff) {
        uVar5 = (ulong)(uVar4 + 1);
        node->mMeshes[uVar6] = uVar1;
        uVar3 = node->mNumMeshes;
      }
      uVar6 = uVar5;
    }
    node->mNumMeshes = uVar4;
    if (uVar4 == 0) {
      if (node->mMeshes != (uint *)0x0) {
        operator_delete__(node->mMeshes);
      }
      node->mMeshes = (uint *)0x0;
    }
  }
  for (uVar6 = 0; uVar6 < node->mNumChildren; uVar6 = uVar6 + 1) {
    UpdateMeshReferences(node->mChildren[uVar6],meshMapping);
  }
  return;
}

Assistant:

void UpdateMeshReferences(aiNode* node, const std::vector<unsigned int>& meshMapping) {
    if (node->mNumMeshes)   {
        unsigned int out = 0;
        for (unsigned int a = 0; a < node->mNumMeshes;++a)  {

            unsigned int ref = node->mMeshes[a];
            if (UINT_MAX != (ref = meshMapping[ref]))   {
                node->mMeshes[out++] = ref;
            }
        }
        // just let the members that are unused, that's much cheaper
        // than a full array realloc'n'copy party ...
        if(!(node->mNumMeshes = out))   {

            delete[] node->mMeshes;
            node->mMeshes = NULL;
        }
    }
    // recursively update all children
    for (unsigned int i = 0; i < node->mNumChildren;++i) {
        UpdateMeshReferences(node->mChildren[i],meshMapping);
    }
}